

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

buffer_appender<char>
fmt::v7::detail::
write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>
          (buffer_appender<char> out,decimal_fp<double> *fp,basic_format_specs<char> *specs,
          float_specs fspecs,char decimal_point)

{
  int iVar1;
  size_t size;
  byte bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  buffer_appender<char> bVar6;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> it;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  char cVar12;
  buffer<char> *buf;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  int num_zeros;
  sign_t sign;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_40_7_ef14d3db write;
  undefined1 local_8d [5];
  sign_t local_88;
  int local_84;
  significand_type *******local_80;
  undefined1 local_74 [8];
  undefined4 uStack_6c;
  significand_type *******local_68;
  undefined8 local_60;
  undefined8 local_58;
  float_specs *local_50;
  significand_type *******local_48;
  int *local_40;
  float_specs local_38;
  
  local_80 = (significand_type *******)fp->significand;
  lVar8 = 0x3f;
  if (((ulong)local_80 | 1) != 0) {
    for (; ((ulong)local_80 | 1) >> lVar8 == 0; lVar8 = lVar8 + -1) {
    }
  }
  local_84 = (uint)*(ushort *)(bsr2log10(int)::data + (uint)((int)lVar8 * 2)) -
             (uint)(local_80 <
                   *(significand_type ********)
                    (basic_data<void>::zero_or_powers_of_10_64_new +
                    (ulong)*(ushort *)(bsr2log10(int)::data + (uint)((int)lVar8 * 2)) * 8));
  uVar10 = fspecs._4_4_;
  local_88 = uVar10 >> 8 & 0xff;
  local_8d[0] = decimal_point;
  local_38 = fspecs;
  if (local_84 < 0) goto LAB_001159af;
  uVar9 = (local_84 + 1) - (uint)(local_88 == none);
  uVar11 = (ulong)uVar9;
  iVar4 = fp->exponent;
  iVar1 = iVar4 + local_84;
  uVar7 = fspecs.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_0011566f:
    iVar4 = iVar4 + local_84 + -1;
    cVar12 = decimal_point;
    if ((uVar10 >> 0x14 & 1) == 0) {
      iVar14 = 0;
      if (local_84 == 1) {
        cVar12 = '\0';
      }
    }
    else {
      iVar14 = 0;
      if (0 < (int)(uVar7 - local_84)) {
        iVar14 = uVar7 - local_84;
      }
      uVar11 = (ulong)(uVar9 + iVar14);
    }
    iVar3 = 1 - iVar1;
    if (0 < iVar1) {
      iVar3 = iVar4;
    }
    lVar8 = 2;
    if (99 < iVar3) {
      lVar8 = (ulong)(999 < iVar3) + 3;
    }
    uVar5 = (3 - (ulong)(cVar12 == '\0')) + uVar11 + lVar8;
    stack0xffffffffffffff90 = (sign_t *)(CONCAT44(uStack_6c,uVar10 >> 8) & 0xffffffff000000ff);
    local_60._0_5_ = CONCAT14(cVar12,local_84);
    local_58 = (decimal_fp<double> *)
               (CONCAT35(local_58._5_3_,CONCAT14(((uVar10 >> 0x10 & 1) == 0) << 5,iVar14)) |
               0x4500000000);
    local_50 = (float_specs *)CONCAT44(local_50._4_4_,iVar4);
    uVar11 = (ulong)specs->width;
    local_68 = local_80;
    if ((long)uVar11 < 1) {
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                    + 0x18) <
          uVar5 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container + 0x10)) {
        (*(code *)**(undefined8 **)
                    out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      }
      bVar6 = write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::dragonbox::decimal_fp<double>,_char>
              ::anon_class_40_7_ef14d3db::operator()
                        ((anon_class_40_7_ef14d3db *)(local_74 + 4),
                         (iterator)
                         out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      return (buffer_appender<char>)
             bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
    }
    uVar15 = 0;
    if (uVar5 <= uVar11) {
      uVar15 = uVar11 - uVar5;
    }
    bVar2 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                     (ulong)((byte)specs->field_0x9 & 0xf));
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) <
        uVar5 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10) + (specs->fill).size_ * uVar15) {
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    }
    uVar11 = uVar15 >> (bVar2 & 0x3f);
    bVar6 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar11,&specs->fill);
    it.container = (buffer<char> *)
                   write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::dragonbox::decimal_fp<double>,_char>
                   ::anon_class_40_7_ef14d3db::operator()
                             ((anon_class_40_7_ef14d3db *)(local_74 + 4),
                              bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container);
    goto LAB_001158bb;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    uVar13 = 0x10;
    if (0 < (int)uVar7) {
      uVar13 = uVar7;
    }
    if ((iVar1 < -3) || ((int)uVar13 < iVar1)) goto LAB_0011566f;
  }
  local_74._0_4_ = iVar1;
  if (iVar4 < 0) {
    if (0 < iVar1) {
      local_8d._1_4_ = uVar7 - local_84 & (int)(uVar10 << 0xb) >> 0x1f;
      local_48 = (significand_type *******)(local_8d + 1);
      uVar10 = local_8d._1_4_;
      if ((int)local_8d._1_4_ < 1) {
        uVar10 = 0;
      }
      size = (ulong)uVar10 + 1 + uVar11;
      unique0x00004e80 = &local_88;
      local_68 = (significand_type *******)&local_80;
      local_60 = &local_84;
      local_58 = (decimal_fp<double> *)local_74;
      local_50 = (float_specs *)local_8d;
      bVar6 = write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(fmt::v7::detail::buffer_appender<char>)_3_&>
                        (out,specs,size,size,(anon_class_48_6_48d028d1 *)(local_74 + 4));
      return (buffer_appender<char>)
             bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
    }
    uVar10 = -iVar1;
    local_8d._1_4_ = uVar10;
    if (SBORROW4(uVar7,uVar10) != (int)(uVar7 + iVar1) < 0) {
      local_8d._1_4_ = uVar7;
    }
    if ((int)uVar7 < 0) {
      local_8d._1_4_ = uVar10;
    }
    if (local_84 != 0) {
      local_8d._1_4_ = uVar10;
    }
    if (-1 < (int)local_8d._1_4_) {
      unique0x00004e80 = &local_88;
      local_68 = (significand_type *******)(local_8d + 1);
      local_60 = &local_84;
      local_58 = (decimal_fp<double> *)&local_38;
      local_50 = (float_specs *)local_8d;
      local_48 = (significand_type *******)&local_80;
      uVar5 = (ulong)specs->width;
      if (-1 < (long)uVar5) {
        uVar11 = (uint)local_8d._1_4_ + uVar11 + 2;
        uVar15 = 0;
        if (uVar11 <= uVar5) {
          uVar15 = uVar5 - uVar11;
        }
        bVar2 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                         (ulong)((byte)specs->field_0x9 & 0xf));
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                             container + 0x18) <
            uVar11 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                     container + 0x10) + (specs->fill).size_ * uVar15) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
        }
        uVar11 = uVar15 >> (bVar2 & 0x3f);
        bVar6 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar11,&specs->fill);
        it.container = (buffer<char> *)
                       write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::dragonbox::decimal_fp<double>,_char>
                       ::anon_class_48_6_9afe1116::operator()
                                 ((anon_class_48_6_9afe1116 *)(local_74 + 4),
                                  bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container);
        goto LAB_001158bb;
      }
    }
    goto LAB_001159af;
  }
  uVar11 = (ulong)(iVar4 + uVar9);
  local_8d._1_4_ = uVar7 - iVar1;
  if ((uVar10 >> 0x14 & 1) != 0) {
    if ((fspecs._4_1_ == '\x02') || (0 < (int)local_8d._1_4_)) {
      if ((int)local_8d._1_4_ < 1) goto LAB_0011580c;
    }
    else {
      local_8d._1_4_ = 1;
    }
    uVar11 = uVar11 + (uint)local_8d._1_4_;
  }
LAB_0011580c:
  unique0x00004e80 = &local_88;
  local_68 = (significand_type *******)&local_80;
  local_60 = &local_84;
  local_50 = &local_38;
  local_48 = (significand_type *******)local_8d;
  local_40 = (int *)(local_8d + 1);
  uVar5 = (ulong)specs->width;
  local_58 = fp;
  if ((long)uVar5 < 0) {
LAB_001159af:
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/congjiye[P]visiable-webrtc-audio-processing/include/spdlog/fmt/bundled/core.h"
                ,0x146,"negative value");
  }
  uVar15 = 0;
  if (uVar11 <= uVar5) {
    uVar15 = uVar5 - uVar11;
  }
  bVar2 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                   (ulong)((byte)specs->field_0x9 & 0xf));
  if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x18) <
      uVar11 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container + 0x10) + (specs->fill).size_ * uVar15) {
    (*(code *)**(undefined8 **)
                out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
              (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
  }
  uVar11 = uVar15 >> (bVar2 & 0x3f);
  bVar6 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar11,&specs->fill);
  it.container = (buffer<char> *)
                 write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::dragonbox::decimal_fp<double>,_char>
                 ::anon_class_56_7_a2a26a24::operator()
                           ((anon_class_56_7_a2a26a24 *)(local_74 + 4),
                            bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                            container);
LAB_001158bb:
  bVar6 = fill<fmt::v7::detail::buffer_appender<char>,char>
                    ((buffer_appender<char>)it.container,uVar15 - uVar11,&specs->fill);
  return (buffer_appender<char>)
         bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}